

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeString::toUTF32
          (UnicodeString *this,UChar32 *utf32,int32_t capacity,UErrorCode *errorCode)

{
  short sVar1;
  uint in_EAX;
  char16_t *src;
  int32_t iVar2;
  ulong uStack_28;
  int32_t length32;
  
  uStack_28 = (ulong)in_EAX;
  iVar2 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    src = getBuffer(this);
    sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    u_strToUTF32WithSub_63(utf32,capacity,&length32,src,iVar2,0xfffd,(int32_t *)0x0,errorCode);
    iVar2 = length32;
  }
  return iVar2;
}

Assistant:

int32_t
UnicodeString::toUTF32(UChar32 *utf32, int32_t capacity, UErrorCode &errorCode) const {
  int32_t length32=0;
  if(U_SUCCESS(errorCode)) {
    // getBuffer() and u_strToUTF32WithSub() check for illegal arguments.
    u_strToUTF32WithSub(utf32, capacity, &length32,
        getBuffer(), length(),
        0xfffd,  // Substitution character.
        NULL,    // Don't care about number of substitutions.
        &errorCode);
  }
  return length32;
}